

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

Error asmjit::Logging::formatInstruction
                (StringBuilder *sb,uint32_t logOptions,CodeEmitter *emitter,uint32_t archType,
                Detail *detail,Operand_ *opArray,uint32_t opCount)

{
  uint uVar1;
  uint uVar2;
  Error EVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  uint32_t advance;
  uint32_t uVar7;
  char *pcVar8;
  undefined1 *puVar9;
  uint uVar10;
  Operand_ *op;
  uint uVar11;
  uint32_t count;
  ulong uVar12;
  uint uVar13;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_40;
  
  uVar1 = detail->options;
  uVar2 = detail->instId;
  uVar6 = (ulong)uVar2;
  if (uVar6 < 0x59c) {
    if (((uVar1 & 0x40) != 0) &&
       (EVar3 = StringBuilder::_opString(sb,1,"short ",0xffffffffffffffff), EVar3 != 0)) {
      return EVar3;
    }
    if (((char)uVar1 < '\0') &&
       (EVar3 = StringBuilder::_opString(sb,1,"long ",0xffffffffffffffff), EVar3 != 0)) {
      return EVar3;
    }
    if (((uVar1 >> 0x10 & 1) != 0) &&
       (EVar3 = StringBuilder::_opString(sb,1,"xacquire ",0xffffffffffffffff), EVar3 != 0)) {
      return EVar3;
    }
    if (((uVar1 >> 0x11 & 1) != 0) &&
       (EVar3 = StringBuilder::_opString(sb,1,"xrelease ",0xffffffffffffffff), EVar3 != 0)) {
      return EVar3;
    }
    if (((uVar1 >> 0xd & 1) != 0) &&
       (EVar3 = StringBuilder::_opString(sb,1,"lock ",0xffffffffffffffff), EVar3 != 0)) {
      return EVar3;
    }
    if ((uVar1 & 0xc000) != 0) {
      pcVar8 = "rep ";
      if ((uVar1 >> 0xe & 1) == 0) {
        pcVar8 = "repnz ";
      }
      StringBuilder::_opString(sb,1,pcVar8,0xffffffffffffffff);
      if ((detail->extraReg)._signature != 0) {
        EVar3 = StringBuilder::_opChar(sb,1,'{');
        if (EVar3 != 0) {
          return EVar3;
        }
        aStack_40._packed[0] = (UInt64)detail->extraReg;
        aStack_40._mem.field_2.offset64 = (anon_union_8_2_78723da6_for_MemData_2)0x0;
        EVar3 = X86Logging::formatOperand
                          (sb,logOptions,emitter,archType,(Operand_ *)&aStack_40._any);
        if (EVar3 != 0) {
          return EVar3;
        }
        EVar3 = StringBuilder::_opString(sb,1,"} ",0xffffffffffffffff);
        if (EVar3 != 0) {
          return EVar3;
        }
      }
    }
    if ((int)uVar1 < 0) {
      if ((uVar1 & 0x1e000000) == 0) {
        EVar3 = StringBuilder::_opString(sb,1,"rex ",0xffffffffffffffff);
        if (EVar3 != 0) {
          return EVar3;
        }
      }
      else {
        StringBuilder::_opString(sb,1,"rex.",0xffffffffffffffff);
        if ((uVar1 >> 0x1b & 1) != 0) {
          StringBuilder::_opChar(sb,1,'r');
        }
        if ((uVar1 >> 0x1a & 1) != 0) {
          StringBuilder::_opChar(sb,1,'x');
        }
        if ((uVar1 >> 0x19 & 1) != 0) {
          StringBuilder::_opChar(sb,1,'b');
        }
        if ((uVar1 >> 0x1c & 1) != 0) {
          StringBuilder::_opChar(sb,1,'w');
        }
        StringBuilder::_opChar(sb,1,' ');
      }
    }
    if (((uVar1 >> 10 & 1) != 0) &&
       (EVar3 = StringBuilder::_opString(sb,1,"vex3 ",0xffffffffffffffff), EVar3 != 0)) {
      return EVar3;
    }
    if (((uVar1 >> 0xc & 1) != 0) &&
       (EVar3 = StringBuilder::_opString(sb,1,"evex ",0xffffffffffffffff), EVar3 != 0)) {
      return EVar3;
    }
    EVar3 = StringBuilder::_opString
                      (sb,1,&X86InstDB::nameData +
                            (*(uint *)(X86InstDB::instData + uVar6 * 0xc) >> 8 & 0x3fff),
                       0xffffffffffffffff);
  }
  else {
    EVar3 = StringBuilder::appendFormat(sb,"<unknown id=#%u>",uVar6);
  }
  if (EVar3 == 0) {
    if (opCount != 0) {
      uVar13 = 0;
      do {
        if ((undefined1  [16])((undefined1  [16])opArray[uVar13].field_0 & (undefined1  [16])0x7) ==
            (undefined1  [16])0x0) break;
        pcVar8 = ", ";
        if (uVar13 == 0) {
          pcVar8 = " ";
        }
        EVar3 = StringBuilder::_opString(sb,1,pcVar8,0xffffffffffffffff);
        if (EVar3 != 0) {
          return EVar3;
        }
        op = opArray + uVar13;
        EVar3 = X86Logging::formatOperand(sb,logOptions,emitter,archType,op);
        if (EVar3 != 0) {
          return EVar3;
        }
        if (((logOptions & 2) == 0) || (((op->field_0)._any.signature & 7) != 3))
        goto switchD_0017b1fb_caseD_41f;
        lVar5 = 0;
        uVar6 = 0x10;
        do {
          uVar10 = *(uint *)((long)&opArray->field_0 + lVar5);
          uVar11 = uVar10 >> 0x18;
          uVar12 = (ulong)uVar11;
          if (uVar11 < (uint)uVar6) {
            uVar12 = uVar6;
          }
          if ((uVar10 & 7) != 1) {
            uVar12 = uVar6;
          }
          lVar5 = lVar5 + 0x10;
          uVar6 = uVar12;
        } while ((ulong)opCount << 4 != lVar5);
        uVar11 = (uint)uVar12;
        uVar10 = (uint)*(byte *)((long)&op->field_0 + 8);
        if ((int)uVar2 < 0x41e) {
          if ((int)uVar2 < 0x27a) {
            if ((int)uVar2 < 0x1ae) {
              uVar4 = uVar2 - 0x68;
              if (uVar4 < 0x2f) {
                if ((0x1bUL >> ((ulong)uVar4 & 0x3f) & 1) != 0) {
                  uVar7 = 3;
LAB_0017b2c2:
                  puVar9 = "eq_oq";
                  advance = 0;
                  count = 1;
                  goto LAB_0017b3ae;
                }
                if ((0x600000000000U >> ((ulong)uVar4 & 0x3f) & 1) != 0)
                goto switchD_0017b1fb_caseD_420;
              }
              if (uVar2 == 0x22) goto switchD_0017b1fb_caseD_455;
              if (uVar2 == 0x23) {
LAB_0017b448:
                uVar4 = uVar11 >> 2;
                goto LAB_0017b499;
              }
            }
            else if ((int)uVar2 < 0x240) {
              if (uVar2 == 0x1d5) goto switchD_0017b1fb_caseD_420;
              if (uVar2 == 0x1ae) {
LAB_0017b678:
                puVar9 = X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                         ::vmpsadbw;
                uVar7 = uVar11 >> 3;
                if (3 < uVar11 >> 3) {
                  uVar7 = 4;
                }
                goto LAB_0017b662;
              }
              if (uVar2 == 0x1d6) goto switchD_0017b1fb_caseD_427;
            }
            else if ((uVar2 - 0x241 < 3) || (uVar2 == 0x240)) goto switchD_0017b1fb_caseD_456;
          }
          else if ((int)uVar2 < 0x307) {
            if ((int)uVar2 < 0x2f5) {
              if (uVar2 == 0x2b4) goto switchD_0017b26c_caseD_569;
              if (uVar2 == 0x2b5) goto switchD_0017b26c_caseD_56a;
              if (uVar2 - 0x27a < 4) goto switchD_0017b26c_caseD_547;
            }
            else {
              if (uVar2 == 0x2f5) goto switchD_0017b1fb_caseD_455;
              if (uVar2 == 0x2f6) goto LAB_0017b448;
            }
          }
          else if ((int)uVar2 < 0x33e) {
            if (uVar2 - 0x307 < 4) {
              uVar7 = 5;
              goto LAB_0017b2c2;
            }
            if (uVar2 == 0x339) goto switchD_0017b1fb_caseD_456;
            if (uVar2 == 0x319) {
              puVar9 = &X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                        ::vroundxx;
              goto LAB_0017b63d;
            }
          }
          else if ((int)uVar2 < 0x3a5) {
            if (uVar2 - 0x33e < 2) goto switchD_0017b1fb_caseD_420;
          }
          else {
            if (uVar2 - 0x3a5 < 4) {
              puVar9 = &X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                        ::vfpclassxx;
LAB_0017b63d:
              uVar7 = 1;
              goto LAB_0017b662;
            }
            if (uVar2 - 0x3bd < 4) {
              puVar9 = &X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                        ::vgetmantxx;
              goto LAB_0017b62c;
            }
            if (uVar2 == 0x3fc) goto LAB_0017b678;
          }
          goto switchD_0017b1fb_caseD_41f;
        }
        if (0x4f8 < (int)uVar2) {
          switch(uVar2) {
          case 0x53f:
          case 0x540:
          case 0x541:
          case 0x542:
          case 0x543:
          case 0x544:
          case 0x545:
          case 0x546:
            puVar9 = &X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                      ::vreducexx_vrndscalexx;
LAB_0017b62c:
            uVar7 = 3;
            goto LAB_0017b662;
          case 0x547:
          case 0x548:
          case 0x549:
          case 0x54a:
switchD_0017b26c_caseD_547:
            puVar9 = &X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                      ::vroundxx;
            goto LAB_0017b65d;
          case 0x54b:
          case 0x54c:
          case 0x54d:
          case 0x54e:
          case 0x54f:
          case 0x550:
          case 0x551:
          case 0x552:
          case 0x553:
          case 0x554:
          case 0x555:
          case 0x556:
          case 0x557:
          case 0x558:
          case 0x559:
          case 0x55a:
          case 0x55b:
          case 0x55c:
          case 0x55d:
          case 0x55e:
          case 0x55f:
          case 0x560:
          case 0x561:
          case 0x562:
          case 0x563:
          case 0x564:
            break;
          case 0x565:
          case 0x566:
          case 0x567:
          case 0x568:
            uVar4 = (uint)(uVar12 >> 4);
            if (uVar4 < 3) {
              uVar4 = 2;
            }
            uVar7 = 2 - (uVar11 < 0x30);
            goto LAB_0017b4bf;
          case 0x569:
switchD_0017b26c_caseD_569:
            uVar7 = 1;
            advance = 2;
            puVar9 = X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                     ::vshufpd;
            count = uVar11 >> 3;
            if (7 < uVar11 >> 3) {
              count = 8;
            }
            goto LAB_0017b3ae;
          case 0x56a:
switchD_0017b26c_caseD_56a:
            puVar9 = X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                     ::vshufps;
            goto LAB_0017b3a8;
          default:
            uVar6 = (ulong)(uVar2 - 0x4fa);
            if (uVar2 - 0x4fa < 0x3b) {
              if ((3UL >> (uVar6 & 0x3f) & 1) != 0) goto switchD_0017b1fb_caseD_456;
              if ((0x600000000U >> (uVar6 & 0x3f) & 1) != 0) goto switchD_0017b1fb_caseD_420;
              if ((0x780000000000000U >> (uVar6 & 0x3f) & 1) != 0) {
                puVar9 = &X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                          ::vrangexx;
                goto LAB_0017b65d;
              }
            }
            if (uVar2 == 0x4f9) goto switchD_0017b1fb_caseD_456;
          }
          goto switchD_0017b1fb_caseD_41f;
        }
        switch(uVar2) {
        case 0x41e:
          uVar4 = uVar11 >> 2;
          if (7 < uVar4) {
            uVar4 = 8;
          }
          goto LAB_0017b499;
        default:
          goto switchD_0017b1fb_caseD_41f;
        case 0x420:
switchD_0017b1fb_caseD_420:
          uVar7 = 1;
          uVar4 = 8;
          break;
        case 0x427:
switchD_0017b1fb_caseD_427:
          puVar9 = X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                   ::vpclmulqdq;
          goto LAB_0017b65d;
        case 0x429:
        case 0x42a:
        case 0x437:
        case 0x438:
        case 0x439:
        case 0x43a:
        case 0x43b:
        case 0x43c:
          puVar9 = "eq";
          goto LAB_0017b3a8;
        case 0x43d:
        case 0x43e:
        case 0x441:
        case 0x442:
        case 0x443:
        case 0x444:
        case 0x445:
        case 0x446:
          puVar9 = "lt";
LAB_0017b3a8:
          uVar7 = 2;
          advance = 4;
          count = 4;
LAB_0017b3ae:
          EVar3 = X86Logging_formatImmText(sb,uVar10,uVar7,advance,puVar9,count);
          goto LAB_0017b4c4;
        case 0x449:
        case 0x44a:
          puVar9 = X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                   ::vperm2x128;
LAB_0017b65d:
          uVar7 = 2;
LAB_0017b662:
          EVar3 = X86Logging_formatImmBits(sb,uVar10,(ImmBits *)puVar9,uVar7);
          goto LAB_0017b4c4;
        case 0x455:
switchD_0017b1fb_caseD_455:
          uVar4 = uVar11 >> 3;
LAB_0017b499:
          uVar7 = 1;
          break;
        case 0x456:
        case 0x457:
        case 0x459:
switchD_0017b1fb_caseD_456:
          uVar7 = 2;
          uVar4 = 4;
        }
LAB_0017b4bf:
        EVar3 = X86Logging_formatImmShuf(sb,uVar10,uVar7,uVar4);
LAB_0017b4c4:
        if (EVar3 != 0) {
          return EVar3;
        }
switchD_0017b1fb_caseD_41f:
        if (uVar13 == 0) {
          if (((detail->extraReg)._signature & 0xf00) == 0x300) {
            EVar3 = StringBuilder::_opString(sb,1," {",0xffffffffffffffff);
            if (EVar3 != 0) {
              return EVar3;
            }
            aStack_40._packed[0] = (UInt64)detail->extraReg;
            aStack_40._mem.field_2.offset64 = (anon_union_8_2_78723da6_for_MemData_2)0x0;
            EVar3 = X86Logging::formatOperand
                              (sb,logOptions,emitter,archType,(Operand_ *)&aStack_40._any);
            if (EVar3 != 0) {
              return EVar3;
            }
            EVar3 = StringBuilder::_opChar(sb,1,'}');
            if (EVar3 != 0) {
              return EVar3;
            }
            if ((uVar1 >> 0x17 & 1) != 0) {
              pcVar8 = "{z}";
LAB_0017b599:
              EVar3 = StringBuilder::_opString(sb,1,pcVar8,0xffffffffffffffff);
              if (EVar3 != 0) {
                return EVar3;
              }
            }
          }
          else if ((uVar1 >> 0x17 & 1) != 0) {
            pcVar8 = " {z}";
            goto LAB_0017b599;
          }
        }
        if ((((op->field_0)._any.signature & 7) == 2 && (uVar1 >> 0x14 & 1) != 0) &&
           (EVar3 = StringBuilder::_opString(sb,1," {1tox}",0xffffffffffffffff), EVar3 != 0)) {
          return EVar3;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != opCount);
    }
    EVar3 = 0;
  }
  return EVar3;
}

Assistant:

Error Logging::formatInstruction(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeEmitter* emitter,
  uint32_t archType,
  const Inst::Detail& detail, const Operand_* opArray, uint32_t opCount) noexcept {

#if defined(ASMJIT_BUILD_X86)
  return X86Logging::formatInstruction(sb, logOptions, emitter, archType, detail, opArray, opCount);
#endif // ASMJIT_BUILD_X86

#if defined(ASMJIT_BUILD_ARM)
  return ArmLogging::formatInstruction(sb, logOptions, emitter, archType, detail, opArray, opCount);
#endif // ASMJIT_BUILD_ARM

  return kErrorInvalidArch;
}